

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderInvarianceRule2Test::verifyResultData
          (TessellationShaderInvarianceRule2Test *this,void **all_iterations_data)

{
  float *value;
  ostringstream *this_00;
  float fVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  pointer p_Var5;
  MessageBuilder *pMVar6;
  TestError *this_01;
  ulong uVar7;
  long lVar8;
  char *__s;
  ulong uVar9;
  float *pfVar10;
  bool ref_point_mode;
  bool cmp_point_mode;
  vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> outer_vertices;
  float ref_inner_tess_levels [2];
  float cmp_inner_tess_levels [2];
  float ref_outer_tess_levels [4];
  float cmp_outer_tess_levels [4];
  _tessellation_shader_vertex_ordering ref_vertex_ordering;
  _tessellation_primitive_mode ref_primitive_mode;
  _tessellation_shader_vertex_ordering cmp_vertex_ordering;
  _tessellation_primitive_mode cmp_primitive_mode;
  string primitive_type;
  undefined1 local_1b0 [8];
  float local_1a8;
  
  lVar8 = 0;
  do {
    if (lVar8 == 2) {
      return;
    }
    pvVar2 = all_iterations_data[lVar8 * 2];
    pvVar3 = all_iterations_data[lVar8 * 2 + 1];
    outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar9 = 0;
        p_Var5 = outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar9 < this->m_n_tessellated_vertices[lVar8 * 2]; uVar9 = uVar9 + 1) {
      pfVar10 = (float *)((ulong)(uint)((int)uVar9 * 3) * 4 + (long)pvVar2);
      bVar4 = TessellationShaderUtils::isOuterEdgeVertex
                        (TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS - (lVar8 == 0),pfVar10);
      p_Var5 = outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (bVar4) {
        for (; p_Var5 != outer_vertices.
                         super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl
                         .super__Vector_impl_data._M_finish; p_Var5 = p_Var5 + 1) {
          if ((p_Var5->u == *pfVar10) && (!NAN(p_Var5->u) && !NAN(*pfVar10))) {
            if ((p_Var5->v == pfVar10[1]) && (!NAN(p_Var5->v) && !NAN(pfVar10[1]))) {
              if ((p_Var5->w == pfVar10[2]) && (!NAN(p_Var5->w) && !NAN(pfVar10[2])))
              goto LAB_00d01e83;
            }
          }
        }
        local_1b0 = *(undefined1 (*) [8])pfVar10;
        local_1a8 = pfVar10[2];
        std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::push_back
                  (&outer_vertices,(value_type *)local_1b0);
      }
LAB_00d01e83:
    }
LAB_00d01e9d:
    if (p_Var5 != outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pfVar10 = &p_Var5->v;
      value = &p_Var5->w;
      uVar9 = 0;
      do {
        if ((ulong)this->m_n_tessellated_vertices[lVar8 * 2 + 1] * 3 == uVar9) {
          __s = "quads";
          if (lVar8 == 0) {
            __s = "triangles";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&primitive_type,__s,(allocator<char> *)local_1b0);
          (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode[0xb])
                    (this,lVar8 * 2,ref_inner_tess_levels,ref_outer_tess_levels,&ref_point_mode,
                     &ref_primitive_mode,&ref_vertex_ordering,0);
          (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode[0xb])
                    (this,lVar8 * 2 + 1U & 0xffffffff,cmp_inner_tess_levels,cmp_outer_tess_levels,
                     &cmp_point_mode,&cmp_primitive_mode,&cmp_vertex_ordering,0);
          local_1b0 = (undefined1  [8])
                      ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                       super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<((ostream *)&local_1a8,"Outer vertex");
          std::operator<<((ostream *)&local_1a8," (");
          pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&p_Var5->u);
          std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,pfVar10);
          std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value);
          this_00 = &pMVar6->m_str;
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,")");
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          " was not found in tessellated data coordinate set generated");
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          " for primitive type: ");
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          primitive_type._M_dataplus._M_p);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          ". Reference inner tessellation level:");
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," (");
          std::ostream::operator<<(this_00,ref_inner_tess_levels[0]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,ref_inner_tess_levels[1]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          "), reference outer tessellation level:");
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," (");
          std::ostream::operator<<(this_00,ref_outer_tess_levels[0]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,ref_outer_tess_levels[1]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,ref_outer_tess_levels[2]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,ref_outer_tess_levels[3]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          "), test inner tessellation level:");
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," (");
          std::ostream::operator<<(this_00,cmp_inner_tess_levels[0]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,cmp_inner_tess_levels[1]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                          "), reference outer tessellation level:");
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," (");
          std::ostream::operator<<(this_00,cmp_outer_tess_levels[0]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,cmp_outer_tess_levels[1]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,cmp_outer_tess_levels[2]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
          std::ostream::operator<<(this_00,cmp_outer_tess_levels[3]);
          std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,").");
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,
                     "Outer edge vertex was not found in tessellated coordinate set generated for the same outer tessellation levels and vertex spacing, but different inner tessellation levels"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                     ,0x4e5);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        uVar7 = uVar9 & 0xffffffff;
        fVar1 = *(float *)((long)pvVar3 + uVar7 * 4);
        if ((fVar1 == p_Var5->u) && (!NAN(fVar1) && !NAN(p_Var5->u))) {
          fVar1 = *(float *)((long)pvVar3 + uVar7 * 4 + 4);
          if ((fVar1 == *pfVar10) && (!NAN(fVar1) && !NAN(*pfVar10))) {
            fVar1 = *(float *)((long)pvVar3 + uVar7 * 4 + 8);
            if ((fVar1 == *value) && (!NAN(fVar1) && !NAN(*value))) goto LAB_00d01ef2;
          }
        }
        uVar9 = uVar9 + 3;
      } while( true );
    }
    std::_Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>::~_Vector_base
              (&outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>);
    lVar8 = lVar8 + 1;
  } while( true );
LAB_00d01ef2:
  p_Var5 = p_Var5 + 1;
  goto LAB_00d01e9d;
}

Assistant:

void TessellationShaderInvarianceRule2Test::verifyResultData(const void** all_iterations_data)
{
	/* Iterate through one tessellated set of vertices for a given primitive type
	 * and identify outer vertices. Make sure exactly the same vertices can be
	 * found in the other set of vertices, generated with different input tessellation
	 * level.
	 */
	for (int n_primitive_type = 0; n_primitive_type < 2; /* triangles / quads */
		 ++n_primitive_type)
	{
		const float*				 data1_ptr		= (const float*)all_iterations_data[n_primitive_type * 2 + 0];
		const float*				 data2_ptr		= (const float*)all_iterations_data[n_primitive_type * 2 + 1];
		_tessellation_primitive_mode primitive_mode = (n_primitive_type == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
		std::vector<_vertex> outer_vertices;

		/* Iterate through all data1 vertices.. */
		for (unsigned int n_vertex = 0; n_vertex < m_n_tessellated_vertices[n_primitive_type * 2]; ++n_vertex)
		{
			/* Check if any of the components is equal to 0 or 1. If so, this could
			 * be an edge vertex.
			 */
			const float* vertex_ptr = data1_ptr + n_vertex * 3; /* components */

			if (TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, vertex_ptr))
			{
				/* Only add the vertex if it has not been added already to the vector */
				bool has_already_been_added = false;

				for (std::vector<_vertex>::const_iterator vertex_iterator = outer_vertices.begin();
					 vertex_iterator != outer_vertices.end(); vertex_iterator++)
				{
					if (vertex_iterator->u == vertex_ptr[0] && vertex_iterator->v == vertex_ptr[1] &&
						vertex_iterator->w == vertex_ptr[2])
					{
						has_already_been_added = true;

						break;
					}
				} /* for (all outer vertices stored so far) */

				if (!has_already_been_added)
				{
					_vertex vertex;

					vertex.u = vertex_ptr[0];
					vertex.v = vertex_ptr[1];
					vertex.w = vertex_ptr[2];

					outer_vertices.push_back(vertex);
				}
			} /* if (input vertex is located on outer edge) */
		}	 /* for (all input vertices) */

		DE_ASSERT(outer_vertices.size() != 0);

		/* Now that we know where outer vertices are, make sure they are present in the other data set */
		for (std::vector<_vertex>::const_iterator ref_vertex_iterator = outer_vertices.begin();
			 ref_vertex_iterator != outer_vertices.end(); ref_vertex_iterator++)
		{
			bool		   has_been_found = false;
			const _vertex& ref_vertex	 = *ref_vertex_iterator;

			for (unsigned int n_vertex = 0; n_vertex < m_n_tessellated_vertices[n_primitive_type * 2 + 1]; ++n_vertex)
			{
				const float* vertex_ptr = data2_ptr + n_vertex * 3; /* components */

				if (vertex_ptr[0] == ref_vertex.u && vertex_ptr[1] == ref_vertex.v && vertex_ptr[2] == ref_vertex.w)
				{
					has_been_found = true;

					break;
				}
			} /* for (all vertices in the other data set) */

			if (!has_been_found)
			{
				float								 cmp_inner_tess_levels[2];
				float								 cmp_outer_tess_levels[4];
				bool								 cmp_point_mode;
				_tessellation_primitive_mode		 cmp_primitive_mode;
				_tessellation_shader_vertex_ordering cmp_vertex_ordering;
				std::string							 primitive_type = (n_primitive_type == 0) ? "triangles" : "quads";
				float								 ref_inner_tess_levels[2];
				float								 ref_outer_tess_levels[4];
				bool								 ref_point_mode;
				_tessellation_primitive_mode		 ref_primitive_mode;
				_tessellation_shader_vertex_ordering ref_vertex_ordering;

				getIterationProperties(n_primitive_type * 2, ref_inner_tess_levels, ref_outer_tess_levels,
									   &ref_point_mode, &ref_primitive_mode, &ref_vertex_ordering, NULL);
				getIterationProperties(n_primitive_type * 2 + 1, cmp_inner_tess_levels, cmp_outer_tess_levels,
									   &cmp_point_mode, &cmp_primitive_mode, &cmp_vertex_ordering, NULL);

				m_testCtx.getLog() << tcu::TestLog::Message << "Outer vertex"
								   << " (" << ref_vertex.u << ", " << ref_vertex.v << ", " << ref_vertex.w << ")"
								   << " was not found in tessellated data coordinate set generated"
								   << " for primitive type: " << primitive_type.c_str()
								   << ". Reference inner tessellation level:"
								   << " (" << ref_inner_tess_levels[0] << ", " << ref_inner_tess_levels[1]
								   << "), reference outer tessellation level:"
								   << " (" << ref_outer_tess_levels[0] << ", " << ref_outer_tess_levels[1] << ", "
								   << ref_outer_tess_levels[2] << ", " << ref_outer_tess_levels[3]
								   << "), test inner tessellation level:"
								   << " (" << cmp_inner_tess_levels[0] << ", " << cmp_inner_tess_levels[1]
								   << "), reference outer tessellation level:"
								   << " (" << cmp_outer_tess_levels[0] << ", " << cmp_outer_tess_levels[1] << ", "
								   << cmp_outer_tess_levels[2] << ", " << cmp_outer_tess_levels[3] << ")."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Outer edge vertex was not found in tessellated coordinate set generated for "
						 "the same outer tessellation levels and vertex spacing, but different inner "
						 "tessellation levels");
			} /* if (outer edge vertex was not found in the other set) */
		}	 /* for (all outer edge vertices) */
	}		  /* for (both primitive types) */
}